

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

int phr_parse_request(char *buf_start,size_t len,char **method,size_t *method_len,char **path,
                     size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  byte *buf_end;
  long lVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  byte bVar7;
  byte *pbVar8;
  int local_3c;
  size_t local_38;
  
  buf_end = (byte *)(buf_start + len);
  local_38 = *num_headers;
  iVar6 = 0;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;
  if (last_len != 0) {
    pbVar3 = (byte *)(buf_start + (last_len - 3));
    if (last_len < 3) {
      pbVar3 = (byte *)buf_start;
    }
    do {
      if (pbVar3 == buf_end) {
        return -2;
      }
      pbVar8 = pbVar3 + 1;
      if (*pbVar3 == 10) {
LAB_0010b6f1:
        iVar2 = iVar6 + 1;
      }
      else {
        iVar2 = 0;
        if (*pbVar3 == 0xd) {
          if (pbVar8 == buf_end) {
            return -2;
          }
          if (*pbVar8 != 10) {
            return -1;
          }
          pbVar8 = pbVar3 + 2;
          goto LAB_0010b6f1;
        }
      }
      iVar6 = iVar2;
      pbVar3 = pbVar8;
    } while (iVar6 != 2);
  }
  if (len != 0) {
    if (*buf_start == '\n') {
      pbVar3 = (byte *)(buf_start + 1);
    }
    else {
      pbVar3 = (byte *)buf_start;
      if (*buf_start == '\r') {
        if (len == 1) {
          return -2;
        }
        if (buf_start[1] != '\n') {
          return -1;
        }
        pbVar3 = (byte *)(buf_start + 2);
      }
    }
    if (pbVar3 != buf_end) {
      sVar5 = 0;
      do {
        if ((ulong)pbVar3[sVar5] == 0x20) {
          *method = (char *)pbVar3;
          *method_len = sVar5;
          pbVar3 = pbVar3 + sVar5 + 1;
          do {
            pbVar8 = pbVar3;
            if (pbVar8 == buf_end) {
              return -2;
            }
            bVar7 = *pbVar8;
            pbVar3 = pbVar8 + 1;
          } while (bVar7 == 0x20);
          sVar5 = 0;
          do {
            if (bVar7 - 0x7f < 0xffffffa1) {
              if (bVar7 < 0x20) {
                return -1;
              }
              if (bVar7 == 0x7f) {
                return -1;
              }
            }
            if (pbVar3 == buf_end) {
              return -2;
            }
            bVar7 = *pbVar3;
            pbVar3 = pbVar3 + 1;
            sVar5 = sVar5 + 1;
          } while (bVar7 != 0x20);
          *path = (char *)pbVar8;
          *path_len = sVar5;
          do {
            pbVar8 = pbVar3;
            if (pbVar8 == buf_end) {
              return -2;
            }
            pbVar3 = pbVar8 + 1;
          } while (*pbVar8 == 0x20);
          if (*method_len != 0) {
            pcVar4 = parse_http_version((char *)pbVar8,(char *)buf_end,minor_version,&local_3c);
            if (pcVar4 == (char *)0x0) {
              return local_3c;
            }
            if (*pcVar4 == '\n') {
              pcVar4 = pcVar4 + 1;
LAB_0010b848:
              pcVar4 = parse_headers(pcVar4,(char *)buf_end,headers,num_headers,local_38,&local_3c);
              if (pcVar4 != (char *)0x0) {
                return (int)pcVar4 - (int)buf_start;
              }
              return local_3c;
            }
            if (*pcVar4 == '\r') {
              if ((byte *)(pcVar4 + 1) == buf_end) {
                return -2;
              }
              if (pcVar4[1] == '\n') {
                pcVar4 = pcVar4 + 2;
                goto LAB_0010b848;
              }
            }
          }
          return -1;
        }
        if (""[pbVar3[sVar5]] == '\0') {
          return -1;
        }
        lVar1 = sVar5 + 1;
        sVar5 = sVar5 + 1;
      } while (pbVar3 + lVar1 != buf_end);
    }
  }
  return -2;
}

Assistant:

int phr_parse_request(const char *buf_start, size_t len, const char **method, size_t *method_len, const char **path,
                      size_t *path_len, int *minor_version, struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf_start + len;
    size_t max_headers = *num_headers;
    int r;

    *method = NULL;
    *method_len = 0;
    *path = NULL;
    *path_len = 0;
    *minor_version = -1;
    *num_headers = 0;

    /* if last_len != 0, check if the request is complete (a fast countermeasure
       againt slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_request(buf, buf_end, method, method_len, path, path_len, minor_version, headers, num_headers, max_headers,
                             &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}